

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::
TestFactoryImpl<google::protobuf::(anonymous_namespace)::GeneratedMessageReflectionCordAccessorsTest_CordSingularBytes_Test>
::CreateTest(TestFactoryImpl<google::protobuf::(anonymous_namespace)::GeneratedMessageReflectionCordAccessorsTest_CordSingularBytes_Test>
             *this)

{
  GeneratedMessageReflectionCordAccessorsTest *this_00;
  
  this_00 = (GeneratedMessageReflectionCordAccessorsTest *)operator_new(1000);
  google::protobuf::anon_unknown_0::GeneratedMessageReflectionCordAccessorsTest::
  GeneratedMessageReflectionCordAccessorsTest(this_00);
  (this_00->super_Test)._vptr_Test =
       (_func_int **)&PTR__GeneratedMessageReflectionCordAccessorsTest_01616ff8;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override { return new TestClass; }